

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

ProStringList * __thiscall
QMakeEvaluator::values
          (ProStringList *__return_storage_ptr__,QMakeEvaluator *this,ProKey *variableName)

{
  ProString *pPVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  const_iterator cVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  char16_t *pcVar9;
  ulong uVar10;
  _List_node_base *p_Var11;
  bool bVar12;
  
  bVar12 = true;
  p_Var11 = (_List_node_base *)&this->m_valuemapStack;
  do {
    p_Var11 = p_Var11->_M_prev;
    if (p_Var11[1]._M_next == (_List_node_base *)0x0) {
      cVar6._M_node = (_Base_ptr)0x0;
    }
    else {
      cVar6 = std::
              _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
              ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                      *)&(p_Var11[1]._M_next)->_M_prev,variableName);
    }
    p_Var8 = (_Base_ptr)(p_Var11[1]._M_next + 1);
    if (p_Var11[1]._M_next == (_List_node_base *)0x0) {
      p_Var8 = (_Base_ptr)0x0;
    }
    if (cVar6._M_node == p_Var8) {
      if (p_Var11 !=
          (this->m_valuemapStack).
          super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
          super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
          ._M_impl._M_node.super__List_node_base._M_next) {
        if (bVar12) {
          pcVar9 = (variableName->super_ProString).m_string.d.ptr;
          if (pcVar9 == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QString::_empty;
          }
          uVar7 = (ulong)(variableName->super_ProString).m_length;
          bVar12 = (long)uVar7 < 1;
          if (0 < (long)uVar7) {
            if (9 < (ushort)(pcVar9[(variableName->super_ProString).m_offset] + L'￐'))
            goto LAB_0027901a;
            uVar5 = 1;
            do {
              uVar10 = uVar5;
              if (uVar7 == uVar10) break;
              uVar5 = uVar10 + 1;
            } while ((ushort)((pcVar9 + (variableName->super_ProString).m_offset)[uVar10] + L'￐')
                     < 10);
            bVar12 = uVar7 <= uVar10;
          }
          if (bVar12) goto LAB_00279022;
        }
LAB_0027901a:
        bVar3 = true;
        goto LAB_0027901c;
      }
LAB_00279022:
      bVar4 = true;
      bVar3 = false;
    }
    else {
      pPVar1 = (ProString *)cVar6._M_node[2]._M_right;
      if (pPVar1 == (ProString *)QMakeInternal::statics._608_8_) goto LAB_00279022;
      p_Var2 = cVar6._M_node[2]._M_left;
      (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)p_Var2;
      (__return_storage_ptr__->super_QList<ProString>).d.ptr = pPVar1;
      (__return_storage_ptr__->super_QList<ProString>).d.size = *(qsizetype *)(cVar6._M_node + 3);
      if (p_Var2 != (_Base_ptr)0x0) {
        LOCK();
        p_Var2->_M_color = p_Var2->_M_color + _S_black;
        UNLOCK();
      }
      bVar3 = false;
LAB_0027901c:
      bVar4 = false;
    }
    bVar12 = false;
    if (!bVar3) {
      if (bVar4) {
        (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
        (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
        (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

ProStringList QMakeEvaluator::values(const ProKey &variableName) const
{
    ProValueMapStack::const_iterator vmi = m_valuemapStack.cend();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
        if (it != (*vmi).constEnd()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            return *it;
        }
        if (vmi == m_valuemapStack.cbegin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return ProStringList();
}